

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O3

void __thiscall InplaceSolverIslandCallback::processConstraints(InplaceSolverIslandCallback *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  btPersistentManifold **ppbVar4;
  btCollisionObject **ppbVar5;
  btTypedConstraint **ppbVar6;
  int i;
  long lVar7;
  
  uVar1 = (this->m_bodies).m_size;
  ppbVar6 = (btTypedConstraint **)0x0;
  ppbVar5 = (btCollisionObject **)0x0;
  if (uVar1 != 0) {
    ppbVar5 = (this->m_bodies).m_data;
  }
  uVar2 = (this->m_manifolds).m_size;
  ppbVar4 = (btPersistentManifold **)0x0;
  if (uVar2 != 0) {
    ppbVar4 = (this->m_manifolds).m_data;
  }
  uVar3 = (this->m_constraints).m_size;
  if (uVar3 != 0) {
    ppbVar6 = (this->m_constraints).m_data;
  }
  (*this->m_solver->_vptr_btConstraintSolver[3])
            (this->m_solver,ppbVar5,(ulong)uVar1,ppbVar4,(ulong)uVar2,ppbVar6,(ulong)uVar3,
             this->m_solverInfo,this->m_debugDrawer,this->m_dispatcher);
  lVar7 = (long)(this->m_bodies).m_size;
  if (lVar7 < 0) {
    if ((this->m_bodies).m_capacity < 0) {
      ppbVar5 = (this->m_bodies).m_data;
      if ((ppbVar5 != (btCollisionObject **)0x0) && ((this->m_bodies).m_ownsMemory == true)) {
        btAlignedFreeInternal(ppbVar5);
      }
      (this->m_bodies).m_ownsMemory = true;
      (this->m_bodies).m_data = (btCollisionObject **)0x0;
      (this->m_bodies).m_capacity = 0;
    }
    do {
      (this->m_bodies).m_data[lVar7] = (btCollisionObject *)0x0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
  }
  (this->m_bodies).m_size = 0;
  lVar7 = (long)(this->m_manifolds).m_size;
  if (lVar7 < 0) {
    if ((this->m_manifolds).m_capacity < 0) {
      ppbVar4 = (this->m_manifolds).m_data;
      if ((ppbVar4 != (btPersistentManifold **)0x0) && ((this->m_manifolds).m_ownsMemory == true)) {
        btAlignedFreeInternal(ppbVar4);
      }
      (this->m_manifolds).m_ownsMemory = true;
      (this->m_manifolds).m_data = (btPersistentManifold **)0x0;
      (this->m_manifolds).m_capacity = 0;
    }
    do {
      (this->m_manifolds).m_data[lVar7] = (btPersistentManifold *)0x0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
  }
  (this->m_manifolds).m_size = 0;
  lVar7 = (long)(this->m_constraints).m_size;
  if (lVar7 < 0) {
    if ((this->m_constraints).m_capacity < 0) {
      ppbVar6 = (this->m_constraints).m_data;
      if ((ppbVar6 != (btTypedConstraint **)0x0) && ((this->m_constraints).m_ownsMemory == true)) {
        btAlignedFreeInternal(ppbVar6);
      }
      (this->m_constraints).m_ownsMemory = true;
      (this->m_constraints).m_data = (btTypedConstraint **)0x0;
      (this->m_constraints).m_capacity = 0;
    }
    do {
      (this->m_constraints).m_data[lVar7] = (btTypedConstraint *)0x0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
  }
  (this->m_constraints).m_size = 0;
  return;
}

Assistant:

void	processConstraints()
	{

		btCollisionObject** bodies = m_bodies.size()? &m_bodies[0]:0;
		btPersistentManifold** manifold = m_manifolds.size()?&m_manifolds[0]:0;
		btTypedConstraint** constraints = m_constraints.size()?&m_constraints[0]:0;

		m_solver->solveGroup( bodies,m_bodies.size(),manifold, m_manifolds.size(),constraints, m_constraints.size() ,*m_solverInfo,m_debugDrawer,m_dispatcher);
		m_bodies.resize(0);
		m_manifolds.resize(0);
		m_constraints.resize(0);

	}